

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt_main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  int iVar3;
  int sig;
  ithread_t cmdloop_thread;
  sigset_t sigs_to_catch;
  char *local_c8;
  uint local_bc;
  pthread_t local_b8;
  sigset_t local_b0;
  
  SampleUtil_Initialize(linux_print);
  if (argc < 2) {
    local_c8 = (char *)0x0;
  }
  else {
    iVar3 = 1;
    local_c8 = (char *)0x0;
    do {
      __s1 = argv[iVar3];
      iVar1 = strcmp(__s1,"-i");
      if (iVar1 == 0) {
        iVar1 = iVar3 + 1;
        local_c8 = argv[(long)iVar3 + 1];
      }
      else {
        iVar2 = strcmp(__s1,"-help");
        iVar1 = iVar3;
        if (iVar2 == 0) {
          SampleUtil_Print("Usage: %s -i interface -help (this message)\n",*argv);
          SampleUtil_Print(
                          "\tinterface:     interface address of the control point\n\t\te.g.: eth0\n"
                          );
          return 1;
        }
      }
      iVar3 = iVar1 + 1;
    } while (iVar3 < argc);
  }
  iVar3 = TvCtrlPointStart(local_c8,(state_update)0x0,0);
  if (iVar3 == 0) {
    iVar1 = pthread_create(&local_b8,(pthread_attr_t *)0x0,TvCtrlPointCommandLoop,(void *)0x0);
    iVar3 = -0x38f;
    if (iVar1 == 0) {
      sigemptyset(&local_b0);
      sigaddset(&local_b0,2);
      sigwait(&local_b0,(int *)&local_bc);
      SampleUtil_Print("Shutting down on signal %d...\n",(ulong)local_bc);
      iVar3 = TvCtrlPointStop();
    }
  }
  else {
    SampleUtil_Print("Error starting UPnP TV Control Point\n");
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
	(void)argc;
	(void)argv;
	char *iface = NULL;
	int rc;
	ithread_t cmdloop_thread;
	int i = 0;
#ifdef _WIN32
#else
	int sig;
	sigset_t sigs_to_catch;
#endif
	int code;

	SampleUtil_Initialize(linux_print);
	/* Parse options */
	for (i = 1; i < argc; i++) {
		if (strcmp(argv[i], "-i") == 0) {
			iface = argv[++i];
		} else if (strcmp(argv[i], "-help") == 0) {
			SampleUtil_Print(
				"Usage: %s -i interface -help (this message)\n",
				argv[0]);
			SampleUtil_Print("\tinterface:     interface address "
					 "of the control point\n"
					 "\t\te.g.: eth0\n");
			return 1;
		}
	}

	rc = TvCtrlPointStart(iface, NULL, 0);
	if (rc != TV_SUCCESS) {
		SampleUtil_Print("Error starting UPnP TV Control Point\n");
		return rc;
	}
	/* start a command loop thread */
	code = ithread_create(
		&cmdloop_thread, NULL, TvCtrlPointCommandLoop, NULL);
	if (code != 0) {
		return UPNP_E_INTERNAL_ERROR;
	}
#ifdef _WIN32
	ithread_join(cmdloop_thread, NULL);
#else
	/* Catch Ctrl-C and properly shutdown */
	sigemptyset(&sigs_to_catch);
	sigaddset(&sigs_to_catch, SIGINT);
	sigwait(&sigs_to_catch, &sig);
	SampleUtil_Print("Shutting down on signal %d...\n", sig);
#endif
	rc = TvCtrlPointStop();

	return rc;
}